

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O1

void __thiscall duckdb::ColumnDataCheckpointer::FinalizeCheckpoint(ColumnDataCheckpointer *this)

{
  ColumnCheckpointState *state;
  ColumnData *this_00;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var1;
  pointer pSVar2;
  reference pvVar3;
  pointer pSVar4;
  size_type __n;
  vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *this_01;
  ColumnDataCheckpointer *this_02;
  reference rVar5;
  SegmentLock l;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_80;
  unique_lock<std::mutex> local_78;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  local_68;
  ColumnDataCheckpointer *local_48;
  ColumnDataCheckpointer *local_40;
  size_type local_38;
  
  this_01 = this->checkpoint_states;
  if ((this_01->
      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_01->
      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_40 = (ColumnDataCheckpointer *)&this->has_changes;
    __n = 0;
    local_48 = this;
    do {
      pvVar3 = vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true>::operator[]
                         (this_01,__n);
      state = pvVar3->_M_data;
      this_00 = state->column_data;
      this_02 = local_40;
      rVar5 = vector<bool,_true>::get<true>((vector<bool,_true> *)local_40,__n);
      local_38 = __n;
      if ((*rVar5._M_p & rVar5._M_mask) == 0) {
        WritePersistentSegments(this_02,state);
      }
      else {
        local_78._M_device =
             &(this_00->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock;
        local_78._M_owns = false;
        ::std::unique_lock<std::mutex>::lock(&local_78);
        local_78._M_owns = true;
        local_68.
        super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (this_00->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
             super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
             .
             super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_68.
        super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)&(this_00->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
                      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                      .
                      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
        local_68.
        super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)&(this_00->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
                      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                      .
                      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                      ._M_impl.super__Vector_impl_data + 0x10);
        (this_00->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
        super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        .
        super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&(this_00->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
                 super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                 .
                 super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                 ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&(this_00->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
                 super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                 .
                 super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
        ::std::unique_lock<std::mutex>::~unique_lock(&local_78);
        ::std::
        vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        ::~vector(&local_68);
      }
      LOCK();
      (this_00->compression).ptr._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      local_78._M_device =
           &(state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock;
      local_78._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_78);
      local_78._M_owns = true;
      local_68.
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
           super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_68.
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&(state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
                    super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                    .
                    super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
      local_68.
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&(state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
                    super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                    .
                    super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                    ._M_impl.super__Vector_impl_data + 0x10);
      (state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(pointer *)
       ((long)&(state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
               super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               .
               super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
      *(pointer *)
       ((long)&(state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
               super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               .
               super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
      ::std::unique_lock<std::mutex>::~unique_lock(&local_78);
      local_78._M_device =
           &(this_00->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock;
      local_78._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_78);
      pSVar2 = local_68.
               super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_78._M_owns = true;
      for (pSVar4 = local_68.
                    super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar2; pSVar4 = pSVar4 + 1
          ) {
        local_80._M_head_impl =
             (pSVar4->node).
             super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
             .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
        (pSVar4->node).
        super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
        super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
        .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
        ColumnData::AppendSegment
                  (this_00,(SegmentLock *)&local_78,
                   (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                    *)&local_80);
        _Var1._M_head_impl = local_80._M_head_impl;
        if (local_80._M_head_impl != (ColumnSegment *)0x0) {
          ColumnSegment::~ColumnSegment(local_80._M_head_impl);
          operator_delete(_Var1._M_head_impl);
        }
        local_80._M_head_impl = (ColumnSegment *)0x0;
      }
      ColumnData::ClearUpdates(this_00);
      ::std::unique_lock<std::mutex>::~unique_lock(&local_78);
      ::std::
      vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ::~vector(&local_68);
      __n = local_38 + 1;
      this_01 = local_48->checkpoint_states;
    } while (__n < (ulong)((long)(this_01->
                                 super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                 ).
                                 super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_01->
                                 super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                 ).
                                 super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void ColumnDataCheckpointer::FinalizeCheckpoint() {
	for (idx_t i = 0; i < checkpoint_states.size(); i++) {
		auto &state = checkpoint_states[i].get();
		auto &col_data = state.column_data;
		if (has_changes[i]) {
			// Move the existing segments out of the column data
			// they will be destructed at the end of the scope
			auto to_delete = col_data.data.MoveSegments();
		} else {
			WritePersistentSegments(state);
		}

		// reset the compression function
		col_data.compression.reset();
		// replace the old tree with the new one
		auto new_segments = state.new_tree.MoveSegments();
		auto l = col_data.data.Lock();
		for (auto &new_segment : new_segments) {
			col_data.AppendSegment(l, std::move(new_segment.node));
		}
		col_data.ClearUpdates();
	}
}